

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int simpleNext(sqlite3_tokenizer_cursor *pCursor,char **ppToken,int *pnBytes,int *piStartOffset,
              int *piEndOffset,int *piPosition)

{
  char cVar1;
  int iVar2;
  sqlite3_tokenizer *psVar3;
  sqlite3_tokenizer *psVar4;
  sqlite3_tokenizer *psVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int n;
  uint uVar10;
  char cVar11;
  int iVar12;
  ulong uVar13;
  uint local_54;
  
  psVar3 = pCursor->pTokenizer;
  psVar4 = pCursor[1].pTokenizer;
  do {
    iVar12 = *(int *)((long)&pCursor[2].pTokenizer + 4);
    uVar7 = (ulong)iVar12;
    uVar10 = *(uint *)&pCursor[2].pTokenizer;
    if ((int)uVar10 <= iVar12) {
      return 0x65;
    }
    while (((uVar6 = (uint)uVar7, local_54 = uVar10, (long)uVar7 < (long)(int)uVar10 &&
            (lVar9 = (long)*(char *)((long)&psVar4->pModule + uVar7), local_54 = uVar6, -1 < lVar9))
           && (*(char *)((long)&psVar3[1].pModule + lVar9) != '\0'))) {
      uVar7 = uVar7 + 1;
      *(uint *)((long)&pCursor[2].pTokenizer + 4) = uVar6 + 1;
    }
    lVar9 = (long)(int)uVar6;
    uVar13 = (ulong)uVar10;
    if ((int)uVar10 < (int)uVar6) {
      uVar13 = uVar7 & 0xffffffff;
    }
    for (; iVar12 = (int)uVar13, lVar9 < (int)uVar10; lVar9 = lVar9 + 1) {
      lVar8 = (long)*(char *)((long)&psVar4->pModule + lVar9);
      iVar12 = (int)lVar9;
      if ((-1 < lVar8) && (*(char *)((long)&psVar3[1].pModule + lVar8) != '\0')) break;
      *(int *)((long)&pCursor[2].pTokenizer + 4) = iVar12 + 1;
    }
    uVar10 = iVar12 - local_54;
    if (uVar10 != 0 && (int)local_54 <= iVar12) {
      if (*(int *)&pCursor[5].pTokenizer < (int)uVar10) {
        *(uint *)&pCursor[5].pTokenizer = uVar10 + 0x14;
        psVar5 = (sqlite3_tokenizer *)sqlite3_realloc(pCursor[4].pTokenizer,uVar10 + 0x14);
        if (psVar5 == (sqlite3_tokenizer *)0x0) {
          return 7;
        }
        pCursor[4].pTokenizer = psVar5;
      }
      uVar7 = 0;
      if (0 < (int)uVar10) {
        uVar7 = (ulong)uVar10;
      }
      for (uVar13 = 0; uVar7 != uVar13; uVar13 = uVar13 + 1) {
        cVar1 = *(char *)((long)&psVar4->pModule + uVar13 + (long)(int)local_54);
        cVar11 = cVar1 + ' ';
        if (0x19 < (byte)(cVar1 + 0xbfU)) {
          cVar11 = cVar1;
        }
        *(char *)((long)&(pCursor[4].pTokenizer)->pModule + uVar13) = cVar11;
      }
      *ppToken = (char *)pCursor[4].pTokenizer;
      *pnBytes = uVar10;
      *piStartOffset = local_54;
      *piEndOffset = *(int *)((long)&pCursor[2].pTokenizer + 4);
      iVar2 = *(int *)&pCursor[3].pTokenizer;
      *(int *)&pCursor[3].pTokenizer = iVar2 + 1;
      *piPosition = iVar2;
      if ((int)local_54 < iVar12) {
        return 0;
      }
    }
  } while( true );
}

Assistant:

static int simpleNext(
  sqlite3_tokenizer_cursor *pCursor,  /* Cursor returned by simpleOpen */
  const char **ppToken,               /* OUT: *ppToken is the token text */
  int *pnBytes,                       /* OUT: Number of bytes in token */
  int *piStartOffset,                 /* OUT: Starting offset of token */
  int *piEndOffset,                   /* OUT: Ending offset of token */
  int *piPosition                     /* OUT: Position integer of token */
){
  simple_tokenizer_cursor *c = (simple_tokenizer_cursor *) pCursor;
  simple_tokenizer *t = (simple_tokenizer *) pCursor->pTokenizer;
  unsigned char *p = (unsigned char *)c->pInput;

  while( c->iOffset<c->nBytes ){
    int iStartOffset;

    /* Scan past delimiter characters */
    while( c->iOffset<c->nBytes && simpleDelim(t, p[c->iOffset]) ){
      c->iOffset++;
    }

    /* Count non-delimiter characters. */
    iStartOffset = c->iOffset;
    while( c->iOffset<c->nBytes && !simpleDelim(t, p[c->iOffset]) ){
      c->iOffset++;
    }

    if( c->iOffset>iStartOffset ){
      int i, n = c->iOffset-iStartOffset;
      if( n>c->nTokenAllocated ){
        char *pNew;
        c->nTokenAllocated = n+20;
        pNew = sqlite3_realloc(c->pToken, c->nTokenAllocated);
        if( !pNew ) return SQLITE_NOMEM;
        c->pToken = pNew;
      }
      for(i=0; i<n; i++){
        /* TODO(shess) This needs expansion to handle UTF-8
        ** case-insensitivity.
        */
        unsigned char ch = p[iStartOffset+i];
        c->pToken[i] = (char)((ch>='A' && ch<='Z') ? ch-'A'+'a' : ch);
      }
      *ppToken = c->pToken;
      *pnBytes = n;
      *piStartOffset = iStartOffset;
      *piEndOffset = c->iOffset;
      *piPosition = c->iToken++;

      return SQLITE_OK;
    }
  }
  return SQLITE_DONE;
}